

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

void __thiscall
brynet::net::AsyncConnector::asyncConnect
          (AsyncConnector *this,string *ip,int port,nanoseconds timeout,
          COMPLETED_CALLBACK *successCB,FAILED_CALLBACK *failedCB)

{
  EventLoop *this_00;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined8 *puVar3;
  runtime_error *this_01;
  shared_ptr<brynet::net::ConnectorWorkInfo> workInfo;
  shared_lock<std::shared_mutex> lck;
  _Any_data local_148;
  code *local_138;
  code *pcStack_130;
  __shared_ptr<brynet::net::ConnectorWorkInfo,_(__gnu_cxx::_Lock_policy)2> local_128;
  AsyncConnectAddr local_118;
  AsyncConnectAddr address;
  
  lck._M_pm = &this->mThreadGuard;
  lck._M_owns = true;
  std::__shared_mutex_pthread::lock_shared(&(lck._M_pm)->_M_impl);
  if (((successCB->super__Function_base)._M_manager == (_Manager_type)0x0) ||
     ((failedCB->super__Function_base)._M_manager == (_Manager_type)0x0)) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"all callback is nullptr");
  }
  else {
    if (*(this->mIsRun).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr != false) {
      std::__shared_ptr<brynet::net::ConnectorWorkInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&workInfo.
                  super___shared_ptr<brynet::net::ConnectorWorkInfo,_(__gnu_cxx::_Lock_policy)2>,
                 &(this->mWorkInfo).
                  super___shared_ptr<brynet::net::ConnectorWorkInfo,_(__gnu_cxx::_Lock_policy)2>);
      AsyncConnectAddr::AsyncConnectAddr(&address,ip,port,timeout,successCB,failedCB);
      this_00 = (this->mEventLoop).
                super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<brynet::net::ConnectorWorkInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_128,
                 &workInfo.
                  super___shared_ptr<brynet::net::ConnectorWorkInfo,_(__gnu_cxx::_Lock_policy)2>);
      AsyncConnectAddr::AsyncConnectAddr(&local_118,&address);
      local_138 = (code *)0x0;
      pcStack_130 = (code *)0x0;
      local_148._M_unused._M_object = (void *)0x0;
      local_148._8_8_ = 0;
      puVar3 = (undefined8 *)operator_new(0x80);
      _Var2._M_pi = local_128._M_refcount._M_pi;
      peVar1 = local_128._M_ptr;
      local_128._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_128._M_ptr = (element_type *)0x0;
      *puVar3 = peVar1;
      puVar3[1] = _Var2._M_pi;
      AsyncConnectAddr::AsyncConnectAddr((AsyncConnectAddr *)(puVar3 + 2),&local_118);
      pcStack_130 = std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/Connector.cpp:421:31)>
                    ::_M_invoke;
      local_138 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/Connector.cpp:421:31)>
                  ::_M_manager;
      local_148._M_unused._M_object = puVar3;
      EventLoop::pushAsyncProc(this_00,(USER_PROC *)&local_148);
      std::_Function_base::~_Function_base((_Function_base *)&local_148);
      asyncConnect(std::__cxx11::string_const&,int,std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::function<void(std::unique_ptr<brynet::net::TcpSocket,brynet::net::TcpSocket::TcpSocketDeleter>)>,std::function<void()>)
      ::$_0::~__0((__0 *)&local_128);
      AsyncConnectAddr::~AsyncConnectAddr(&address);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&workInfo.
                  super___shared_ptr<brynet::net::ConnectorWorkInfo,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::shared_lock<std::shared_mutex>::~shared_lock(&lck);
      return;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"work thread already stop");
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AsyncConnector::asyncConnect(const std::string& ip, 
    int port, 
    std::chrono::nanoseconds timeout,
    COMPLETED_CALLBACK successCB, 
    FAILED_CALLBACK failedCB)
{
#ifdef HAVE_LANG_CXX17
    std::shared_lock<std::shared_mutex> lck(mThreadGuard);
#else
    std::lock_guard<std::mutex> lck(mThreadGuard);
#endif

    if (successCB == nullptr || failedCB == nullptr)
    {
        throw std::runtime_error("all callback is nullptr");
    }

    if (!(*mIsRun))
    {
        throw std::runtime_error("work thread already stop");
    }

    auto workInfo = mWorkInfo;
    auto address = AsyncConnectAddr(ip,
        port,
        timeout,
        successCB,
        failedCB);
    mEventLoop->pushAsyncProc([workInfo, address]() {
        workInfo->processConnect(address);
    });
}